

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.c
# Opt level: O3

void SHA1Final(uchar *digest,SHA1_CTX *context)

{
  byte bVar1;
  ulong uVar2;
  long lVar3;
  uchar local_31 [8];
  uchar local_29 [8];
  uchar c;
  
  bVar1 = 0;
  uVar2 = 0;
  do {
    local_31[uVar2] = (uchar)(context->count[uVar2 < 4] >> (~bVar1 & 0x18));
    uVar2 = uVar2 + 1;
    bVar1 = bVar1 + 8;
  } while (uVar2 != 8);
  local_29[0] = 0x80;
  SHA1Update(context,local_29,1);
  if ((context->count[0] & 0x1f8) != 0x1c0) {
    do {
      local_29[0] = '\0';
      SHA1Update(context,local_29,1);
    } while ((context->count[0] & 0x1f8) != 0x1c0);
  }
  SHA1Update(context,local_31,8);
  bVar1 = 0;
  lVar3 = 0;
  do {
    digest[lVar3] =
         (uchar)(*(uint *)((long)context->state + (ulong)((uint)lVar3 & 0xfffffffc)) >>
                (~bVar1 & 0x18));
    lVar3 = lVar3 + 1;
    bVar1 = bVar1 + 8;
  } while (lVar3 != 0x14);
  context->buffer[0x30] = '\0';
  context->buffer[0x31] = '\0';
  context->buffer[0x32] = '\0';
  context->buffer[0x33] = '\0';
  context->buffer[0x34] = '\0';
  context->buffer[0x35] = '\0';
  context->buffer[0x36] = '\0';
  context->buffer[0x37] = '\0';
  context->buffer[0x38] = '\0';
  context->buffer[0x39] = '\0';
  context->buffer[0x3a] = '\0';
  context->buffer[0x3b] = '\0';
  context->buffer[0x3c] = '\0';
  context->buffer[0x3d] = '\0';
  context->buffer[0x3e] = '\0';
  context->buffer[0x3f] = '\0';
  context->buffer[0x24] = '\0';
  context->buffer[0x25] = '\0';
  context->buffer[0x26] = '\0';
  context->buffer[0x27] = '\0';
  context->buffer[0x28] = '\0';
  context->buffer[0x29] = '\0';
  context->buffer[0x2a] = '\0';
  context->buffer[0x2b] = '\0';
  context->buffer[0x2c] = '\0';
  context->buffer[0x2d] = '\0';
  context->buffer[0x2e] = '\0';
  context->buffer[0x2f] = '\0';
  context->buffer[0x30] = '\0';
  context->buffer[0x31] = '\0';
  context->buffer[0x32] = '\0';
  context->buffer[0x33] = '\0';
  context->buffer[0x14] = '\0';
  context->buffer[0x15] = '\0';
  context->buffer[0x16] = '\0';
  context->buffer[0x17] = '\0';
  context->buffer[0x18] = '\0';
  context->buffer[0x19] = '\0';
  context->buffer[0x1a] = '\0';
  context->buffer[0x1b] = '\0';
  context->buffer[0x1c] = '\0';
  context->buffer[0x1d] = '\0';
  context->buffer[0x1e] = '\0';
  context->buffer[0x1f] = '\0';
  context->buffer[0x20] = '\0';
  context->buffer[0x21] = '\0';
  context->buffer[0x22] = '\0';
  context->buffer[0x23] = '\0';
  context->buffer[4] = '\0';
  context->buffer[5] = '\0';
  context->buffer[6] = '\0';
  context->buffer[7] = '\0';
  context->buffer[8] = '\0';
  context->buffer[9] = '\0';
  context->buffer[10] = '\0';
  context->buffer[0xb] = '\0';
  context->buffer[0xc] = '\0';
  context->buffer[0xd] = '\0';
  context->buffer[0xe] = '\0';
  context->buffer[0xf] = '\0';
  context->buffer[0x10] = '\0';
  context->buffer[0x11] = '\0';
  context->buffer[0x12] = '\0';
  context->buffer[0x13] = '\0';
  *(undefined8 *)(context->state + 4) = 0;
  *(undefined8 *)(context->count + 1) = 0;
  context->state[0] = 0;
  context->state[1] = 0;
  context->state[2] = 0;
  context->state[3] = 0;
  return;
}

Assistant:

void SHA1Final(unsigned char digest[20], SHA1_CTX* context)
{
    unsigned i;
    unsigned char finalcount[8];
    unsigned char c;

#if 0	/* untested "improvement" by DHR */
    /* Convert context->count to a sequence of bytes
     * in finalcount.  Second element first, but
     * big-endian order within element.
     * But we do it all backwards.
     */
    unsigned char *fcp = &finalcount[8];

    for (i = 0; i < 2; i++)
       {
        uint32_t t = context->count[i];
        int j;

        for (j = 0; j < 4; t >>= 8, j++)
	          *--fcp = (unsigned char) t;
    }
#else
    for (i = 0; i < 8; i++) {
        finalcount[i] = (unsigned char)((context->count[(i >= 4 ? 0 : 1)]
         >> ((3-(i & 3)) * 8) ) & 255);  /* Endian independent */
    }
#endif
    c = 0200;
    SHA1Update(context, &c, 1);
    while ((context->count[0] & 504) != 448) {
	c = 0000;
        SHA1Update(context, &c, 1);
    }
    SHA1Update(context, finalcount, 8);  /* Should cause a SHA1Transform() */
    for (i = 0; i < 20; i++) {
        digest[i] = (unsigned char)
         ((context->state[i>>2] >> ((3-(i & 3)) * 8) ) & 255);
    }
    /* Wipe variables */
    memset(context, '\0', sizeof(*context));
    memset(&finalcount, '\0', sizeof(finalcount));
}